

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module_info.cpp
# Opt level: O2

void refresh_mem_info(void)

{
  istream *piVar1;
  string s;
  ifstream file;
  stringstream ss;
  
  std::ifstream::ifstream(&file);
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  s._M_dataplus._M_p = (pointer)&s.field_2;
  s._M_string_length = 0;
  s.field_2._M_local_buf[0] = '\0';
  std::ifstream::open((char *)&file,0x14d00e);
  piVar1 = std::operator>>((istream *)&file,(string *)&s);
  piVar1 = std::istream::_M_extract<unsigned_long>((ulong *)piVar1);
  piVar1 = std::operator>>(piVar1,(string *)&s);
  piVar1 = std::operator>>(piVar1,(string *)&s);
  piVar1 = std::istream::_M_extract<unsigned_long>((ulong *)piVar1);
  piVar1 = std::operator>>(piVar1,(string *)&s);
  piVar1 = std::operator>>(piVar1,(string *)&s);
  std::istream::_M_extract<unsigned_long>((ulong *)piVar1);
  std::__cxx11::string::~string((string *)&s);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  std::ifstream::~ifstream(&file);
  return;
}

Assistant:

static void refresh_mem_info() {
    std::ifstream file;
    std::stringstream ss;
    std::string s;

    file.open("/proc/meminfo", std::fstream::in);
    file >> s >> mem_total >> s >> s >> mem_free >> s >> s >> mem_available;
}